

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_fwd_aload(jit_State *J)

{
  TRef TVar1;
  TRef local_1c;
  IRRef ref;
  jit_State *J_local;
  
  local_1c = fwd_ahload(J,(uint)(J->fold).ins.field_0.op1);
  if ((local_1c == 0) && (local_1c = fwd_aload_reassoc(J), local_1c == 0)) {
    TVar1 = lj_ir_emit(J);
    return TVar1;
  }
  return local_1c;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_aload(jit_State *J)
{
  IRRef ref;
  if ((ref = fwd_ahload(J, fins->op1)) ||
      (ref = fwd_aload_reassoc(J)))
    return ref;
  return EMITFOLD;
}